

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O3

Expression * __thiscall CFG::Block::Render(Block *this,RelooperBuilder *Builder,bool InLoop)

{
  _Rb_tree_header *p_Var1;
  ulong *puVar2;
  uint uVar3;
  int iVar4;
  _func_int **pp_Var5;
  _List_node_base *p_Var6;
  uint *puVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  Name *Value;
  Block *this_00;
  LocalSet *item;
  Block *any;
  Binary *this_01;
  Binary *this_02;
  long *plVar12;
  Block *pBVar13;
  undefined8 *puVar14;
  size_type sVar15;
  Block *any_00;
  undefined8 uVar16;
  Expression *pEVar17;
  Block *pBVar18;
  undefined1 auVar19 [8];
  Break *this_03;
  Switch *item_00;
  _List_node_base *p_Var20;
  Shape *pSVar21;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar22;
  ulong uVar23;
  ulong uVar24;
  pointer pcVar25;
  Branch *pBVar26;
  uint uVar27;
  size_type *this_04;
  _Self __tmp;
  _List_node_base *p_Var28;
  undefined1 uVar29;
  MixedArena *pMVar30;
  uint *puVar31;
  bool bVar32;
  bool bVar33;
  string_view sVar34;
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>,_bool> pVar35;
  string_view sVar36;
  string_view sVar37;
  pointer *local_188;
  long local_180;
  pointer local_178 [2];
  uint local_164;
  undefined8 local_160;
  Block *local_158;
  size_type *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string_view local_128;
  undefined1 auStack_118 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> Table;
  size_t local_f8;
  _Hash_node_base *local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> Base;
  Shape *local_c0;
  ulong *local_b8;
  IString *local_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  map<CFG::Block_*,_wasm::Name,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
  BlockNameMap;
  Block *local_58;
  Block *local_48;
  Binary *local_40;
  
  pMVar30 = &((Builder->super_Builder).wasm)->allocator;
  this_00 = (Block *)MixedArena::allocSpace(pMVar30,0x40,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (this_00->name).super_IString.str._M_len = 0;
  (this_00->name).super_IString.str._M_str = (char *)0x0;
  (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this_00->list).allocator = pMVar30;
  uVar22 = extraout_RDX;
  if ((this->IsCheckedMultipleEntry & InLoop) == 1) {
    item = RelooperBuilder::makeSetLabel(Builder,0);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    uVar22 = extraout_RDX_00;
  }
  if (this->Code != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               this->Code);
    uVar22 = extraout_RDX_01;
  }
  pp_Var5 = (_func_int **)(this->ProcessedBranchesOut).Map._M_h._M_element_count;
  if (pp_Var5 == (_func_int **)0x0) goto LAB_00ab601c;
  local_c0 = this->Parent->Next;
  BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)CONCAT71((int7)((ulong)uVar22 >> 8),1);
  if ((local_c0 == (Shape *)0x0) || (local_c0->Type != Multiple)) {
    local_c0 = (Shape *)0x0;
    bVar33 = true;
  }
  else {
    this->Parent->Next = local_c0->Next;
    bVar33 = pp_Var5 != local_c0[2]._vptr_Shape || this->SwitchCondition != (Expression *)0x0;
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  }
  uVar22 = &(this->ProcessedBranchesOut).List;
  p_Var28 = (this->ProcessedBranchesOut).List.
            super__List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var28 == (_List_node_base *)uVar22) {
LAB_00ab60d4:
    __assert_fail("DefaultTarget",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                  ,0xe9,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
  }
  pBVar13 = (Block *)0x0;
  p_Var20 = p_Var28;
  do {
    if (this->SwitchCondition == (Expression *)0x0) {
      p_Var6 = p_Var20[1]._M_prev[1]._M_next;
    }
    else {
      p_Var6 = p_Var20[1]._M_prev[1]._M_prev;
    }
    local_158 = this;
    if (p_Var6 == (_List_node_base *)0x0) {
      if (pBVar13 != (Block *)0x0) {
        __assert_fail("!DefaultTarget && \"block has branches without a default (nullptr for the \" \"condition)\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                      ,0xe4,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
      }
      pBVar13 = (Block *)p_Var20[1]._M_next;
    }
    p_Var20 = p_Var20->_M_next;
  } while (p_Var20 != (_List_node_base *)uVar22);
  if (pBVar13 == (Block *)0x0) goto LAB_00ab60d4;
  Base.field_2._8_8_ = uVar22;
  if (this->SwitchCondition == (Expression *)0x0) {
    auStack_98 = (undefined1  [8])0x0;
    BlockNameMap._M_t._M_impl._0_8_ = 0;
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    __str_2.field_2._8_8_ = &local_c0[1].Id;
    local_160 = (Shape *)CONCAT44(local_160._4_4_,(uint)InLoop);
    local_40 = (Binary *)0x0;
    local_58 = (Block *)0x0;
    local_48 = (Block *)0x0;
LAB_00ab5337:
    if (p_Var28 != (_List_node_base *)uVar22) {
      if ((Block *)p_Var28[1]._M_next != pBVar13) {
        pBVar26 = (Branch *)p_Var28[1]._M_prev;
        pBVar18 = (Block *)p_Var28[1]._M_next;
        if (pBVar26->Condition == (Expression *)0x0) {
          __assert_fail("Details->Condition",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                        ,0x102,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
        }
        goto LAB_00ab5386;
      }
      goto LAB_00ab5610;
    }
    Base._M_dataplus._M_p = (pointer)0x0;
    local_e8 = (undefined1  [8])pBVar13;
    pVar35 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::insert
                       (&this->ProcessedBranchesOut,
                        (pair<CFG::Block_*const,_CFG::Branch_*> *)local_e8);
    pBVar26 = (Branch *)pVar35.first._M_node._M_node[1]._M_prev;
    pBVar18 = pBVar13;
LAB_00ab5386:
    if (bVar33) {
      bVar32 = pBVar18->IsCheckedMultipleEntry;
    }
    else {
      bVar32 = false;
    }
    if ((BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ == '\0') &&
       (sVar15 = std::
                 map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                 ::count((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                          *)(local_c0 + 1),&pBVar18->Id), sVar15 != 0)) {
      if (pBVar26->Type != Break) {
        __assert_fail("Details->Type == Branch::Break",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                      ,0x10a,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
      }
      pBVar26->Type = Direct;
      bVar9 = true;
    }
    else {
      bVar9 = false;
    }
    if (((bVar32 == false) && (pBVar26->Type == Direct && !bVar9)) &&
       (pBVar26->Code == (Expression *)0x0)) {
LAB_00ab54fe:
      pEVar17 = pBVar26->Condition;
      this_01 = (Binary *)MixedArena::allocSpace(&((Builder->super_Builder).wasm)->allocator,0x20,8)
      ;
      (((SpecificExpression<(wasm::Expression::Id)15> *)
       &this_01->super_SpecificExpression<(wasm::Expression::Id)16>)->super_Expression)._id =
           UnaryId;
      (((SpecificExpression<(wasm::Expression::Id)15> *)
       &this_01->super_SpecificExpression<(wasm::Expression::Id)16>)->super_Expression).type.id = 0;
      this_01->op = EqZInt32;
      this_01->left = pEVar17;
      ::wasm::Unary::finalize((Unary *)this_01);
      this_02 = this_01;
      if (local_40 != (Binary *)0x0) {
        this_02 = (Binary *)
                  MixedArena::allocSpace(&((Builder->super_Builder).wasm)->allocator,0x28,8);
        (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        this_02->op = AndInt32;
        this_02->left = (Expression *)local_40;
        this_02->right = (Expression *)this_01;
        ::wasm::Binary::finalize(this_02);
      }
      uVar22 = Base.field_2._8_8_;
      local_40 = this_02;
      if (p_Var28 == (_List_node_base *)Base.field_2._8_8_) goto LAB_00ab56bb;
LAB_00ab5610:
      p_Var28 = p_Var28->_M_next;
      goto LAB_00ab5337;
    }
    any = (Block *)Branch::Render(pBVar26,Builder,pBVar18,bVar32);
    if (bVar9) {
      pSVar21 = local_c0[1].Next;
      uVar22 = __str_2.field_2._8_8_;
      if (pSVar21 != (Shape *)0x0) {
        iVar4 = pBVar18->Id;
        uVar16 = __str_2.field_2._8_8_;
        do {
          if (iVar4 <= (int)pSVar21->Type) {
            uVar16 = pSVar21;
          }
          pSVar21 = (&pSVar21->Next)[(int)pSVar21->Type < iVar4];
        } while (pSVar21 != (Shape *)0x0);
        if ((uVar16 != __str_2.field_2._8_8_) &&
           (uVar22 = uVar16, iVar4 < (int)((Shape *)uVar16)->Type)) {
          uVar22 = __str_2.field_2._8_8_;
        }
      }
      pEVar17 = (Expression *)
                (**(code **)(*((Shape *)(uVar22 + 0x28))->_vptr_Shape + 0x10))
                          (((Shape *)(uVar22 + 0x28))->_vptr_Shape,Builder,
                           (ulong)local_160 & 0xffffffff);
      any = (Block *)::wasm::Builder::blockify(&Builder->super_Builder,(Expression *)any,pEVar17);
    }
    if (any == (Block *)0x0) goto LAB_00ab54fe;
    if (p_Var28 != (_List_node_base *)Base.field_2._8_8_) {
      pEVar17 = pBVar26->Condition;
      pBVar18 = (Block *)MixedArena::allocSpace(&((Builder->super_Builder).wasm)->allocator,0x28,8);
      (((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar18->relooper)->super_Expression)._id =
           IfId;
      (pBVar18->BranchesOut).Map._M_h._M_buckets = (__buckets_ptr)0x0;
      (pBVar18->BranchesOut).Map._M_h._M_bucket_count = (size_type)pEVar17;
      (pBVar18->BranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)any;
      (pBVar18->BranchesOut).Map._M_h._M_element_count = 0;
      ::wasm::If::finalize((If *)pBVar18);
      local_e8 = (undefined1  [8])pBVar18;
      if (BlockNameMap._M_t._M_impl._0_8_ ==
          BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_) {
        std::vector<wasm::If*,std::allocator<wasm::If*>>::_M_realloc_insert<wasm::If*const&>
                  ((vector<wasm::If*,std::allocator<wasm::If*>> *)auStack_98,
                   (iterator)BlockNameMap._M_t._M_impl._0_8_,(If **)local_e8);
      }
      else {
        *(Block **)BlockNameMap._M_t._M_impl._0_8_ = pBVar18;
        BlockNameMap._M_t._M_impl._0_8_ = BlockNameMap._M_t._M_impl._0_8_ + 8;
      }
      if (local_58 == (Block *)0x0) {
        if (local_48 != (Block *)0x0) {
          __assert_fail("!Root",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                        ,0x12d,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
        }
        local_48 = (Block *)local_e8;
        uVar22 = Base.field_2._8_8_;
        local_58 = (Block *)local_e8;
      }
      else {
        (local_58->BranchesOut).Map._M_h._M_element_count = (size_type)local_e8;
        ::wasm::If::finalize((If *)local_58);
        uVar22 = Base.field_2._8_8_;
        local_58 = (Block *)local_e8;
      }
      goto LAB_00ab5610;
    }
    if (local_40 != (Binary *)0x0) {
      pBVar13 = (Block *)MixedArena::allocSpace(&((Builder->super_Builder).wasm)->allocator,0x28,8);
      (((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar13->relooper)->super_Expression)._id =
           IfId;
      (pBVar13->BranchesOut).Map._M_h._M_buckets = (__buckets_ptr)0x0;
      (pBVar13->BranchesOut).Map._M_h._M_bucket_count = (size_type)local_40;
      (pBVar13->BranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)any;
      (pBVar13->BranchesOut).Map._M_h._M_element_count = 0;
      ::wasm::If::finalize((If *)pBVar13);
      if ((((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar13->relooper)->super_Expression).
          _id != IfId) {
        __assert_fail("int(_id) == int(T::SpecificId)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                      ,0x314,"T *wasm::Expression::cast() [T = wasm::If]");
      }
      local_e8 = (undefined1  [8])pBVar13;
      std::vector<wasm::If*,std::allocator<wasm::If*>>::emplace_back<wasm::If*>
                ((vector<wasm::If*,std::allocator<wasm::If*>> *)auStack_98,(If **)local_e8);
      any = pBVar13;
    }
    if (local_58 == (Block *)0x0) {
      bVar33 = local_48 != (Block *)0x0;
      local_48 = any;
      if (bVar33) {
        __assert_fail("!Root",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                      ,0x123,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
      }
    }
    else {
      (local_58->BranchesOut).Map._M_h._M_element_count = (size_type)any;
      ::wasm::If::finalize((If *)local_58);
    }
LAB_00ab56bb:
    while ((undefined1  [8])BlockNameMap._M_t._M_impl._0_8_ != auStack_98) {
      puVar14 = (undefined8 *)(BlockNameMap._M_t._M_impl._0_8_ + -8);
      BlockNameMap._M_t._M_impl._0_8_ = BlockNameMap._M_t._M_impl._0_8_ + -8;
      ::wasm::If::finalize((If *)*puVar14);
    }
    if (BlockNameMap._M_t._M_impl._0_8_ != 0) {
      operator_delete((void *)auStack_98,
                      BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                      BlockNameMap._M_t._M_impl._0_8_);
    }
    if (local_48 == (Block *)0x0) goto LAB_00ab601c;
  }
  else {
    p_Var1 = &BlockNameMap._M_t._M_impl.super__Rb_tree_header;
    auStack_98 = (undefined1  [8])p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_98,"switch$","");
    uVar3 = local_158->Id;
    uVar8 = -uVar3;
    if (0 < (int)uVar3) {
      uVar8 = uVar3;
    }
    uVar27 = 1;
    if (9 < uVar8) {
      uVar23 = (ulong)uVar8;
      uVar10 = 4;
      do {
        uVar27 = uVar10;
        uVar11 = (uint)uVar23;
        if (uVar11 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_00ab5708;
        }
        if (uVar11 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_00ab5708;
        }
        if (uVar11 < 10000) goto LAB_00ab5708;
        uVar23 = uVar23 / 10000;
        uVar10 = uVar27 + 4;
      } while (99999 < uVar11);
      uVar27 = uVar27 + 1;
    }
LAB_00ab5708:
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar27 - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_b8),uVar27,uVar8);
    uVar22 = Base.field_2._8_8_;
    uVar23 = (long)&(local_b0->str)._M_len + BlockNameMap._M_t._M_impl._0_8_;
    uVar24 = 0xf;
    if (auStack_98 != (undefined1  [8])p_Var1) {
      uVar24 = BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    }
    if (uVar24 < uVar23) {
      uVar24 = 0xf;
      if (local_b8 != &local_a8) {
        uVar24 = local_a8;
      }
      if (uVar24 < uVar23) goto LAB_00ab5798;
      plVar12 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_b8,0,(char *)0x0,(ulong)auStack_98);
    }
    else {
LAB_00ab5798:
      plVar12 = (long *)std::__cxx11::string::_M_append(auStack_98,(ulong)local_b8);
    }
    local_e8 = (undefined1  [8])&Base._M_string_length;
    pBVar13 = (Block *)(plVar12 + 2);
    if ((Block *)*plVar12 == pBVar13) {
      Base._M_string_length =
           *(size_type *)
            &((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar13->relooper)->super_Expression;
      Base.field_2._M_allocated_capacity = plVar12[3];
    }
    else {
      Base._M_string_length =
           *(size_type *)
            &((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar13->relooper)->super_Expression;
      local_e8 = (undefined1  [8])*plVar12;
    }
    Base._M_dataplus._M_p = (pointer)plVar12[1];
    *plVar12 = (long)pBVar13;
    plVar12[1] = 0;
    *(undefined1 *)
     &(((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar13->relooper)->super_Expression)._id =
         InvalidId;
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    uVar29 = SUB81(pBVar13,0);
    if (auStack_98 != (undefined1  [8])p_Var1) {
      operator_delete((void *)auStack_98,
                      BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    }
    auStack_98 = (undefined1  [8])p_Var1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_98,local_e8,Base._M_dataplus._M_p + (long)local_e8);
    std::__cxx11::string::append(auStack_98);
    sVar36._M_str = (char *)0x0;
    sVar36._M_len = (size_t)auStack_98;
    local_128 = ::wasm::IString::interned
                          ((IString *)BlockNameMap._M_t._M_impl._0_8_,sVar36,(bool)uVar29);
    if (auStack_98 != (undefined1  [8])p_Var1) {
      operator_delete((void *)auStack_98,
                      BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    }
    auStack_98 = (undefined1  [8])p_Var1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_98,local_e8,Base._M_dataplus._M_p + (long)local_e8);
    std::__cxx11::string::append(auStack_98);
    sVar37._M_str = (char *)0x0;
    sVar37._M_len = (size_t)auStack_98;
    sVar36 = ::wasm::IString::interned
                       ((IString *)BlockNameMap._M_t._M_impl._0_8_,sVar37,(bool)uVar29);
    if (auStack_98 != (undefined1  [8])p_Var1) {
      operator_delete((void *)auStack_98,
                      BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
    }
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&BlockNameMap;
    BlockNameMap._M_t._M_impl._0_8_ = (ulong)(uint)BlockNameMap._M_t._M_impl._4_4_ << 0x20;
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pMVar30 = &((Builder->super_Builder).wasm)->allocator;
    BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pBVar13 = (Block *)MixedArena::allocSpace(pMVar30,0x40,8);
    (((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar13->relooper)->super_Expression)._id =
         BlockId;
    (pBVar13->BranchesOut).Map._M_h._M_buckets = (__buckets_ptr)0x0;
    (pBVar13->BranchesOut).Map._M_h._M_bucket_count = 0;
    (pBVar13->BranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pBVar13->BranchesOut).Map._M_h._M_element_count = 0;
    *(undefined8 *)&(pBVar13->BranchesOut).Map._M_h._M_rehash_policy = 0;
    (pBVar13->BranchesOut).Map._M_h._M_rehash_policy._M_next_resize = 0;
    (pBVar13->BranchesOut).Map._M_h._M_single_bucket = (__node_base_ptr)pMVar30;
    auStack_118 = (undefined1  [8])0x0;
    Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    plVar12 = *(long **)uVar22;
    local_f8 = sVar36._M_len;
    local_f0 = (_Hash_node_base *)sVar36._M_str;
    local_48 = pBVar13;
    if (plVar12 != (long *)uVar22) {
      local_160 = local_c0 + 1;
      __str_2.field_2._8_8_ = &local_c0[1].Id;
      local_164 = (uint)InLoop;
      do {
        sVar37 = local_128;
        if (*(long *)(plVar12[3] + 0x18) != 0) {
          local_150 = &__str_2._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,local_e8,Base._M_dataplus._M_p + (long)local_e8);
          std::__cxx11::string::append((char *)&local_150);
          uVar3 = *(uint *)(plVar12[2] + 0x150);
          uVar8 = -uVar3;
          if (0 < (int)uVar3) {
            uVar8 = uVar3;
          }
          uVar27 = 1;
          if (9 < uVar8) {
            uVar23 = (ulong)uVar8;
            uVar10 = 4;
            do {
              uVar27 = uVar10;
              uVar11 = (uint)uVar23;
              if (uVar11 < 100) {
                uVar27 = uVar27 - 2;
                goto LAB_00ab5aa4;
              }
              if (uVar11 < 1000) {
                uVar27 = uVar27 - 1;
                goto LAB_00ab5aa4;
              }
              if (uVar11 < 10000) goto LAB_00ab5aa4;
              uVar23 = uVar23 / 10000;
              uVar10 = uVar27 + 4;
            } while (99999 < uVar11);
            uVar27 = uVar27 + 1;
          }
LAB_00ab5aa4:
          local_188 = local_178;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_188,(char)uVar27 - (char)((int)uVar3 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_188),uVar27,uVar8);
          pcVar25 = (pointer)0xf;
          if (local_150 != &__str_2._M_string_length) {
            pcVar25 = (pointer)__str_2._M_string_length;
          }
          if (pcVar25 < __str_2._M_dataplus._M_p + local_180) {
            pcVar25 = (pointer)0xf;
            if (local_188 != local_178) {
              pcVar25 = local_178[0];
            }
            if (pcVar25 < __str_2._M_dataplus._M_p + local_180) goto LAB_00ab5b3e;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_188,0,(char *)0x0,(ulong)local_150);
          }
          else {
LAB_00ab5b3e:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_188);
          }
          local_b8 = &local_a8;
          puVar2 = puVar14 + 2;
          if ((ulong *)*puVar14 == puVar2) {
            local_a8 = *puVar2;
            uStack_a0 = puVar14[3];
          }
          else {
            local_a8 = *puVar2;
            local_b8 = (ulong *)*puVar14;
          }
          local_b0 = (IString *)puVar14[1];
          *puVar14 = puVar2;
          puVar14[1] = 0;
          *(undefined1 *)puVar2 = 0;
          sVar34._M_str = (char *)0x0;
          sVar34._M_len = (size_t)local_b8;
          sVar37 = ::wasm::IString::interned(local_b0,sVar34,SUB81(puVar2,0));
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          if (local_188 != local_178) {
            operator_delete(local_188,(ulong)(local_178[0] + 1));
          }
          if (local_150 != &__str_2._M_string_length) {
            operator_delete(local_150,__str_2._M_string_length + 1);
          }
        }
        if (bVar33) {
          uVar29 = *(undefined1 *)(plVar12[2] + 0x168);
        }
        else {
          uVar29 = false;
        }
        if (BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ == '\0') {
          sVar15 = std::
                   map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                   ::count((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                            *)local_160,(key_type_conflict1 *)(plVar12[2] + 0x150));
          pBVar26 = (Branch *)plVar12[3];
          if (sVar15 == 0) goto LAB_00ab5c98;
          if (pBVar26->Type != Break) {
            __assert_fail("Details->Type == Branch::Break",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                          ,0x15e,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
          }
          pBVar26->Type = Direct;
          bVar32 = true;
        }
        else {
          pBVar26 = (Branch *)plVar12[3];
LAB_00ab5c98:
          bVar32 = false;
        }
        if ((((bool)uVar29 != false) || (pBVar26->Type != Direct || bVar32)) ||
           (pBVar26->Code != (Expression *)0x0)) {
          any_00 = (Block *)Branch::Render(pBVar26,Builder,(Block *)plVar12[2],(bool)uVar29);
          if (bVar32) {
            pSVar21 = local_c0[1].Next;
            uVar22 = __str_2.field_2._8_8_;
            if (pSVar21 != (Shape *)0x0) {
              iVar4 = *(int *)(plVar12[2] + 0x150);
              uVar16 = __str_2.field_2._8_8_;
              do {
                if (iVar4 <= (int)pSVar21->Type) {
                  uVar16 = pSVar21;
                }
                pSVar21 = (&pSVar21->Next)[(int)pSVar21->Type < iVar4];
              } while (pSVar21 != (Shape *)0x0);
              if ((uVar16 != __str_2.field_2._8_8_) &&
                 (uVar22 = uVar16, iVar4 < (int)((Shape *)uVar16)->Type)) {
                uVar22 = __str_2.field_2._8_8_;
              }
            }
            pEVar17 = (Expression *)
                      (**(code **)(*((Shape *)(uVar22 + 0x28))->_vptr_Shape + 0x10))
                                (((Shape *)(uVar22 + 0x28))->_vptr_Shape,Builder,local_164);
            any_00 = ::wasm::Builder::blockify(&Builder->super_Builder,(Expression *)any_00,pEVar17)
            ;
          }
          if (any_00 == (Block *)0x0) {
            pBVar26 = (Branch *)plVar12[3];
            goto LAB_00ab5ddb;
          }
          pMVar30 = &((Builder->super_Builder).wasm)->allocator;
          pBVar18 = (Block *)MixedArena::allocSpace(pMVar30,0x40,8);
          (((SpecificExpression<(wasm::Expression::Id)1> *)&pBVar18->relooper)->super_Expression).
          _id = BlockId;
          (pBVar18->BranchesOut).Map._M_h._M_buckets = (__buckets_ptr)0x0;
          (pBVar18->BranchesOut).Map._M_h._M_bucket_count = 0;
          (pBVar18->BranchesOut).Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (pBVar18->BranchesOut).Map._M_h._M_element_count = 0;
          *(undefined8 *)&(pBVar18->BranchesOut).Map._M_h._M_rehash_policy = 0;
          (pBVar18->BranchesOut).Map._M_h._M_rehash_policy._M_next_resize = 0;
          (pBVar18->BranchesOut).Map._M_h._M_single_bucket = (__node_base_ptr)pMVar30;
          this_04 = &(pBVar18->BranchesOut).Map._M_h._M_element_count;
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_04
                     ,(Expression *)local_48);
          (local_48->BranchesOut).Map._M_h._M_bucket_count = sVar37._M_len;
          (local_48->BranchesOut).Map._M_h._M_before_begin = (__node_base)sVar37._M_str;
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_04
                     ,(Expression *)any_00);
          sVar34 = local_128;
          local_48 = pBVar18;
          if ((any_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id
              != 1) {
            this_03 = (Break *)MixedArena::allocSpace
                                         (&((Builder->super_Builder).wasm)->allocator,0x30,8);
            (this_03->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id =
                 BreakId;
            (this_03->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id =
                 1;
            (this_03->name).super_IString.str._M_len = local_f8;
            (this_03->name).super_IString.str._M_str = (char *)local_f0;
            this_03->value = (Expression *)0x0;
            this_03->condition = (Expression *)0x0;
            ::wasm::Break::finalize(this_03);
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       this_04,(Expression *)this_03);
            sVar34 = local_128;
          }
        }
        else {
LAB_00ab5ddb:
          auVar19 = auStack_118;
          sVar34 = local_128;
          sVar37 = sVar36;
          if ((pBVar26->SwitchValues)._M_t.
              super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            for (; sVar34 = sVar36,
                auVar19 !=
                (undefined1  [8])
                Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start; auVar19 = (undefined1  [8])((long)auVar19 + 0x10))
            {
              if ((((pointer)auVar19)->super_IString).str._M_str == local_128._M_str) {
                (((pointer)auVar19)->super_IString).str._M_len = local_f8;
                (((pointer)auVar19)->super_IString).str._M_str = (char *)local_f0;
              }
            }
          }
        }
        local_128 = sVar34;
        local_40 = (Binary *)sVar37._M_str;
        local_58 = (Block *)sVar37._M_len;
        puVar14 = *(undefined8 **)(plVar12[3] + 0x18);
        if (puVar14 != (undefined8 *)0x0) {
          puVar7 = (uint *)puVar14[1];
          for (puVar31 = (uint *)*puVar14; puVar31 != puVar7; puVar31 = puVar31 + 1) {
            uVar23 = (ulong)*puVar31;
            while ((ulong)((long)Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                 _M_impl.super__Vector_impl_data._M_start - (long)auStack_118 >> 4)
                   <= uVar23) {
              if (Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<wasm::Name,std::allocator<wasm::Name>>::
                _M_realloc_insert<wasm::Name_const&>
                          ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_118,
                           (iterator)
                           Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                           .super__Vector_impl_data._M_start,(Name *)&local_128);
              }
              else {
                ((Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_IString).str._M_len = local_128._M_len;
                ((Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_IString).str._M_str = local_128._M_str;
                Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start =
                     Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
            }
            (((pointer)((long)auStack_118 + uVar23 * 0x10))->super_IString).str._M_len =
                 (size_t)local_58;
            (((pointer)((long)auStack_118 + uVar23 * 0x10))->super_IString).str._M_str =
                 (char *)local_40;
          }
        }
        plVar12 = (long *)*plVar12;
      } while (plVar12 != (long *)Base.field_2._8_8_);
    }
    (local_48->BranchesOut).Map._M_h._M_bucket_count = local_f8;
    (local_48->BranchesOut).Map._M_h._M_before_begin._M_nxt = local_f0;
    item_00 = ::wasm::Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                        (&Builder->super_Builder,
                         (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_118,
                         (Name)local_128,local_158->SwitchCondition,(Expression *)0x0);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               &(pBVar13->BranchesOut).Map._M_h._M_element_count,(Expression *)item_00);
    if (auStack_118 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_118,
                      (long)Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_118);
    }
    std::
    _Rb_tree<CFG::Block_*,_std::pair<CFG::Block_*const,_wasm::Name>,_std::_Select1st<std::pair<CFG::Block_*const,_wasm::Name>_>,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
    ::~_Rb_tree((_Rb_tree<CFG::Block_*,_std::pair<CFG::Block_*const,_wasm::Name>,_std::_Select1st<std::pair<CFG::Block_*const,_wasm::Name>_>,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
                 *)auStack_98);
    if (local_e8 != (undefined1  [8])&Base._M_string_length) {
      operator_delete((void *)local_e8,Base._M_string_length + 1);
    }
  }
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(this_00->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)local_48);
LAB_00ab601c:
  ::wasm::Block::finalize(this_00);
  return (Expression *)this_00;
}

Assistant:

wasm::Expression* Block::Render(RelooperBuilder& Builder, bool InLoop) {
  auto* Ret = Builder.makeBlock();
  if (IsCheckedMultipleEntry && InLoop) {
    Ret->list.push_back(Builder.makeSetLabel(0));
  }
  if (Code) {
    Ret->list.push_back(Code);
  }

  if (!ProcessedBranchesOut.size()) {
    Ret->finalize();
    return Ret;
  }

  // in some cases it is clear we can avoid setting label, see later
  bool SetLabel = true;

  // A setting of the label variable (label = x) is necessary if it can
  // cause an impact. The main case is where we set label to x, then elsewhere
  // we check if label is equal to that value, i.e., that label is an entry
  // in a multiple block. We also need to reset the label when we enter
  // that block, so that each setting is a one-time action: consider
  //
  //    while (1) {
  //      if (check) label = 1;
  //      if (label == 1) { label = 0 }
  //    }
  //
  // (Note that this case is impossible due to fusing, but that is not
  // material here.) So setting to 0 is important just to clear the 1 for
  // future iterations.
  // TODO: When inside a loop, if necessary clear the label variable
  //       once on the top, and never do settings that are in effect clears

  // Fusing: If the next is a Multiple, we can fuse it with this block. Note
  // that we must be the Inner of a Simple, so fusing means joining a Simple
  // to a Multiple. What happens there is that all options in the Multiple
  // *must* appear in the Simple (the Simple is the only one reaching the
  // Multiple), so we can remove the Multiple and add its independent groups
  // into the Simple's branches.
  MultipleShape* Fused = Shape::IsMultiple(Parent->Next);
  if (Fused) {
    PrintDebug("Fusing Multiple to Simple\n", 0);
    Parent->Next = Parent->Next->Next;
    // When the Multiple has the same number of groups as we have branches,
    // they will all be fused, so it is safe to not set the label at all.
    // If a switch, then we can have multiple branches to the same target
    // (in different table indexes), and so this check is not sufficient
    // TODO: optimize
    if (SetLabel && Fused->InnerMap.size() == ProcessedBranchesOut.size() &&
        !SwitchCondition) {
      SetLabel = false;
    }
  }

  // The block we branch to without checking the condition, if none of the other
  // conditions held.
  Block* DefaultTarget = nullptr;

  // Find the default target, the one without a condition
  for (auto& [Target, Details] : ProcessedBranchesOut) {
    if ((!SwitchCondition && !Details->Condition) ||
        (SwitchCondition && !Details->SwitchValues)) {
      assert(!DefaultTarget &&
             "block has branches without a default (nullptr for the "
             "condition)"); // Must be exactly one default // nullptr
      DefaultTarget = Target;
    }
  }
  // Since each Block* must* branch somewhere, this must be set
  assert(DefaultTarget);

  // root of the main part, that we are about to emit
  wasm::Expression* Root = nullptr;

  if (!SwitchCondition) {
    // We'll emit a chain of if-elses
    wasm::If* CurrIf = nullptr;

    // we build an if, then add a child, then add a child to that, etc., so we
    // must finalize them in reverse order
    std::vector<wasm::If*> finalizeStack;

    wasm::Expression* RemainingConditions = nullptr;

    for (auto iter = ProcessedBranchesOut.begin();; iter++) {
      Block* Target;
      Branch* Details;
      if (iter != ProcessedBranchesOut.end()) {
        Target = iter->first;
        if (Target == DefaultTarget) {
          continue; // done at the end
        }
        Details = iter->second;
        // must have a condition if this is not the default target
        assert(Details->Condition);
      } else {
        Target = DefaultTarget;
        Details = ProcessedBranchesOut[DefaultTarget];
      }
      bool SetCurrLabel = SetLabel && Target->IsCheckedMultipleEntry;
      bool HasFusedContent = Fused && contains(Fused->InnerMap, Target->Id);
      if (HasFusedContent) {
        assert(Details->Type == Branch::Break);
        Details->Type = Branch::Direct;
      }
      wasm::Expression* CurrContent = nullptr;
      bool IsDefault = iter == ProcessedBranchesOut.end();
      if (SetCurrLabel || Details->Type != Branch::Direct || HasFusedContent ||
          Details->Code) {
        CurrContent = Details->Render(Builder, Target, SetCurrLabel);
        if (HasFusedContent) {
          CurrContent = Builder.blockify(
            CurrContent,
            Fused->InnerMap.find(Target->Id)->second->Render(Builder, InLoop));
        }
      }
      // If there is nothing to show in this branch, omit the condition
      if (CurrContent) {
        if (IsDefault) {
          wasm::Expression* Now;
          if (RemainingConditions) {
            Now = Builder.makeIf(RemainingConditions, CurrContent);
            finalizeStack.push_back(Now->cast<wasm::If>());
          } else {
            Now = CurrContent;
          }
          if (!CurrIf) {
            assert(!Root);
            Root = Now;
          } else {
            CurrIf->ifFalse = Now;
            CurrIf->finalize();
          }
        } else {
          auto* Now = Builder.makeIf(Details->Condition, CurrContent);
          finalizeStack.push_back(Now);
          if (!CurrIf) {
            assert(!Root);
            Root = CurrIf = Now;
          } else {
            CurrIf->ifFalse = Now;
            CurrIf->finalize();
            CurrIf = Now;
          }
        }
      } else {
        auto* Now = Builder.makeUnary(wasm::EqZInt32, Details->Condition);
        if (RemainingConditions) {
          RemainingConditions =
            Builder.makeBinary(wasm::AndInt32, RemainingConditions, Now);
        } else {
          RemainingConditions = Now;
        }
      }
      if (IsDefault) {
        break;
      }
    }

    // finalize the if-chains
    while (finalizeStack.size() > 0) {
      wasm::If* curr = finalizeStack.back();
      finalizeStack.pop_back();
      curr->finalize();
    }

  } else {
    // Emit a switch
    auto Base = std::string("switch$") + std::to_string(Id);
    auto SwitchDefault = wasm::Name(Base + "$default");
    auto SwitchLeave = wasm::Name(Base + "$leave");
    std::map<Block*, wasm::Name> BlockNameMap;
    auto* Outer = Builder.makeBlock();
    auto* Inner = Outer;
    std::vector<wasm::Name> Table;
    for (auto& [Target, Details] : ProcessedBranchesOut) {
      wasm::Name CurrName;
      if (Details->SwitchValues) {
        CurrName = wasm::Name(Base + "$case$" + std::to_string(Target->Id));
      } else {
        CurrName = SwitchDefault;
      }
      // generate the content for this block
      bool SetCurrLabel = SetLabel && Target->IsCheckedMultipleEntry;
      bool HasFusedContent = Fused && contains(Fused->InnerMap, Target->Id);
      if (HasFusedContent) {
        assert(Details->Type == Branch::Break);
        Details->Type = Branch::Direct;
      }
      wasm::Expression* CurrContent = nullptr;
      if (SetCurrLabel || Details->Type != Branch::Direct || HasFusedContent ||
          Details->Code) {
        CurrContent = Details->Render(Builder, Target, SetCurrLabel);
        if (HasFusedContent) {
          CurrContent = Builder.blockify(
            CurrContent,
            Fused->InnerMap.find(Target->Id)->second->Render(Builder, InLoop));
        }
      }
      // generate a block to branch to, if we have content
      if (CurrContent) {
        auto* NextOuter = Builder.makeBlock();
        NextOuter->list.push_back(Outer);
        // breaking on Outer leads to the content in NextOuter
        Outer->name = CurrName;
        NextOuter->list.push_back(CurrContent);
        // if this is not a dead end, also need to break to the outside this is
        // both an optimization, and avoids incorrectness as adding a break in
        // unreachable code can make a place look reachable that isn't
        if (CurrContent->type != wasm::Type::unreachable) {
          NextOuter->list.push_back(Builder.makeBreak(SwitchLeave));
        }
        // prepare for more nesting
        Outer = NextOuter;
      } else {
        CurrName = SwitchLeave; // just go out straight from the table
        if (!Details->SwitchValues) {
          // this is the default, and it has no content. So make the default be
          // the leave
          for (auto& Value : Table) {
            if (Value == SwitchDefault) {
              Value = SwitchLeave;
            }
          }
          SwitchDefault = SwitchLeave;
        }
      }
      if (Details->SwitchValues) {
        for (auto Value : *Details->SwitchValues) {
          while (Table.size() <= Value) {
            Table.push_back(SwitchDefault);
          }
          Table[Value] = CurrName;
        }
      }
    }
    // finish up the whole pattern
    Outer->name = SwitchLeave;
    Inner->list.push_back(
      Builder.makeSwitch(Table, SwitchDefault, SwitchCondition));
    Root = Outer;
  }

  if (Root) {
    Ret->list.push_back(Root);
  }
  Ret->finalize();

  return Ret;
}